

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sumStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ushort uVar1;
  Mem *pRec;
  double *pdVar2;
  i64 iVar3;
  Mem *pMem;
  double dVar4;
  
  if ((context->pMem->flags & 0x2000) == 0) {
    pdVar2 = (double *)createAggContext(context,0x20);
  }
  else {
    pdVar2 = (double *)context->pMem->z;
  }
  pRec = *argv;
  uVar1 = pRec->flags;
  if ((uVar1 & 0xf) == 2) {
    applyNumericAffinity(pRec,0);
    uVar1 = pRec->flags;
  }
  if (pdVar2 == (double *)0x0) {
    return;
  }
  if ((0x55555555U >> (uVar1 & 0x1f) & 1) == 0) {
    return;
  }
  pdVar2[2] = (double)((long)pdVar2[2] + 1);
  if ((0x50505050U >> (uVar1 & 0x1f) & 1) == 0) {
    dVar4 = sqlite3VdbeRealValue(*argv);
    *pdVar2 = dVar4 + *pdVar2;
    *(undefined1 *)((long)pdVar2 + 0x19) = 1;
    return;
  }
  iVar3 = sqlite3VdbeIntValue(*argv);
  *pdVar2 = (double)iVar3 + *pdVar2;
  if (*(char *)(pdVar2 + 3) != '\0' || *(char *)((long)pdVar2 + 0x19) != '\0') {
    return;
  }
  dVar4 = pdVar2[1];
  if (iVar3 < 0) {
    if ((-1 < (long)dVar4) || (-0x7fffffffffffffff - (long)dVar4 <= iVar3 + 1)) goto LAB_00258d48;
  }
  else if ((long)dVar4 < 1 || iVar3 <= 0x7fffffffffffffff - (long)dVar4) {
LAB_00258d48:
    pdVar2[1] = (double)((long)dVar4 + iVar3);
    return;
  }
  *(undefined1 *)(pdVar2 + 3) = 1;
  return;
}

Assistant:

static void sumStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  if( p && type!=SQLITE_NULL ){
    p->cnt++;
    if( type==SQLITE_INTEGER ){
      i64 v = sqlite3_value_int64(argv[0]);
      p->rSum += v;
      if( (p->approx|p->overflow)==0 && sqlite3AddInt64(&p->iSum, v) ){
        p->overflow = 1;
      }
    }else{
      p->rSum += sqlite3_value_double(argv[0]);
      p->approx = 1;
    }
  }
}